

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O2

void OnDiskIndex::on_disk_merge_core
               (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,RawFile *out,
               TaskSpec *task)

{
  size_t *psVar1;
  pointer puVar2;
  pointer pIVar3;
  size_t __nbytes;
  uint64_t uVar4;
  runtime_error *this;
  ulong uVar5;
  FileId base;
  pointer puVar6;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *__range2;
  long lVar7;
  __off_t in_R8;
  IndexMergeHelper *ndx_1;
  pointer pIVar8;
  uint trigram;
  ulong uVar9;
  void *__buf;
  ulong uVar10;
  IndexMergeHelper *ndx;
  unsigned_long uVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  PosixRunWriter writer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> batch_vector;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&offsets,0x1000001,(allocator_type *)&writer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&batch_vector,0x40000000,(allocator_type *)&writer);
  writer.fd_ = out->fd;
  writer.out_bytes_ = 0;
  writer.prev_ = -1;
  writer.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  writer.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  writer.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar11 = 0x10;
  uVar9 = 0;
  while( true ) {
    trigram = (uint)uVar9;
    if (0xffffff < trigram) {
      PosixRunWriter::flush(&writer);
      offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[0x1000000] = uVar11;
      RawFile::write<unsigned_long>
                (out,offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                 (long)offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      PosixRunWriter::~PosixRunWriter(&writer);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&batch_vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    uVar4 = find_max_batch(indexes,trigram,0x40000000);
    if (uVar4 == 0) break;
    pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    puVar6 = batch_vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pIVar8 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)
                  ._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar3; pIVar8 = pIVar8 + 1)
    {
      psVar1 = (pIVar8->run_offset_cache).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      __nbytes = *psVar1;
      __buf = (void *)(psVar1[uVar4] - __nbytes);
      RawFile::pread(&pIVar8->index->ndxfile,(int)puVar6,__buf,__nbytes,in_R8);
      puVar6 = puVar6 + (long)__buf;
    }
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = uVar4 & 0xffffffff;
    }
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 + uVar9] = uVar11;
      pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      lVar7 = 0;
      base = 0;
      for (pIVar8 = (indexes->
                    super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)._M_impl
                    .super__Vector_impl_data._M_start; pIVar8 != pIVar3; pIVar8 = pIVar8 + 1) {
        puVar2 = (pIVar8->run_offset_cache).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9;
        PosixRunWriter::write_raw
                  (&writer,base,
                   batch_vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + (puVar2[uVar10] - *puVar2) + lVar7,
                   batch_vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + (puVar2[uVar10 + 1] - *puVar2) + lVar7
                  );
        puVar2 = (pIVar8->run_offset_cache).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar9;
        lVar7 = (lVar7 - *puVar2) + puVar2[uVar4];
        base = base + pIVar8->file_count;
      }
      uVar11 = uVar11 + writer.out_bytes_;
      writer.out_bytes_ = 0;
      writer.prev_ = -1;
    }
    if (task != (TaskSpec *)0x0) {
      LOCK();
      (task->work_done_).super___atomic_base<unsigned_long>._M_i =
           (task->work_done_).super___atomic_base<unsigned_long>._M_i + uVar4;
      UNLOCK();
    }
    uVar9 = (ulong)(trigram + (int)uVar4);
  }
  spdlog::error<char[46]>((char (*) [46])"Merge too big, can\'t fit into MAX_BATCH_BYTES");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Can\'t merge, batch size too big");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OnDiskIndex::on_disk_merge_core(
    const std::vector<IndexMergeHelper> &indexes, RawFile *out,
    TaskSpec *task) {
    // Offsets to every run in the file (including the header).
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    // Current offset in the file (equal to size of the header intially).
    uint64_t out_offset = 16;

    // Arbitrary number describing how much RAM we want to spend on the run
    // cache during the batched stream pass.
    constexpr uint64_t MAX_BATCH_BYTES = 1024ULL * 1024ULL * 1024ULL;

    // Vector used for all merge passes (to avoid unnecessary reallocations).
    std::vector<uint8_t> batch_vector(MAX_BATCH_BYTES);
    uint8_t *batch_data = batch_vector.data();

    PosixRunWriter writer(out->get());

    // Main merge loop.
    TriGram trigram = 0;
    while (trigram < NUM_TRIGRAMS) {
        uint64_t batch_size = find_max_batch(indexes, trigram, MAX_BATCH_BYTES);

        if (batch_size == 0) {
            // TODO(unknown): fallback to old unbatched merge method.
            spdlog::error("Merge too big, can't fit into MAX_BATCH_BYTES");
            throw std::runtime_error("Can't merge, batch size too big");
        }

        // Read batch_size runs at once.
        uint8_t *batch_ptr = batch_data;
        for (const auto &ndx : indexes) {
            OnDiskRun run = ndx.run(trigram, batch_size);
            ndx.index->ndxfile.pread(batch_ptr, run.size(), run.start());
            batch_ptr += run.size();
        }

        // Write the runs to the output file in a proper order.
        for (int i = 0; i < static_cast<int>(batch_size); i++) {
            offsets[trigram + i] = out_offset;
            uint64_t base_bytes = 0;
            FileId base_files = 0;
            for (const auto &ndx : indexes) {
                uint8_t *run_base = batch_data + base_bytes;
                uint8_t *run_start = run_base + ndx.run(trigram, i).size();
                uint8_t *run_end = run_base + ndx.run(trigram, i + 1).size();
                writer.write_raw(base_files, run_start, run_end);
                base_bytes += ndx.run(trigram, batch_size).size();
                base_files += ndx.file_count;
            }
            out_offset += writer.bytes_written();
            writer.reset();
        }

        // Bookkeeping - update progress and current trigram ndx.
        if (task != nullptr) {
            task->add_progress(batch_size);
        }
        trigram += batch_size;
    }
    writer.flush();

    // Write the footer - 128MB header with run offsets.
    offsets[NUM_TRIGRAMS] = out_offset;
    out->write<uint64_t>(offsets.data(), offsets.size());
}